

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_CDict *pZVar1;
  undefined1 auVar2 [32];
  ZSTD_CDict *cdict;
  size_t sVar3;
  long lVar4;
  long lVar5;
  size_t __size;
  undefined1 local_78 [16];
  ZSTD_CDict *pZStack_68;
  ZSTD_CDict *pZStack_60;
  undefined1 local_58 [16];
  undefined4 uStack_48;
  int iStack_44;
  ZSTD_cwksp_alloc_phase_e ZStack_40;
  undefined4 uStack_3c;
  
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    lVar4 = 0;
    if (cParams.strategy != ZSTD_fast) {
      lVar4 = 4L << ((byte)cParams.chainLog & 0x3f);
    }
    lVar5 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2b40;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar5 = 0x2b40;
    }
    __size = lVar5 + (4L << ((byte)cParams.hashLog & 0x3f)) + lVar4;
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      cdict = (ZSTD_CDict *)malloc(__size);
    }
    else {
      cdict = (ZSTD_CDict *)(*customMem.customAlloc)(customMem.opaque,__size);
    }
    if (cdict != (ZSTD_CDict *)0x0) {
      if (((ulong)cdict & 7) != 0) {
        __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1dad,"void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t)");
      }
      local_78._8_8_ = (long)&cdict->dictContent + __size;
      local_78._0_8_ = cdict;
      pZStack_68 = cdict;
      local_58._0_8_ = cdict;
      auVar2 = _local_58;
      _local_58 = auVar2._0_24_;
      ZStack_40 = 0;
      auVar2 = _local_58;
      pZStack_60 = cdict;
      local_58._8_8_ = local_78._8_8_;
      _iStack_44 = auVar2._20_12_;
      uStack_48 = 0;
      ZSTD_cwksp_assert_internal_consistency((ZSTD_cwksp *)local_78);
      iStack_44 = 0;
      ZSTD_cwksp_assert_internal_consistency((ZSTD_cwksp *)local_78);
      ZSTD_cwksp_assert_internal_consistency((ZSTD_cwksp *)local_78);
      if ((long)__size < 0x1340) {
        uStack_48 = 1;
        cdict = (ZSTD_CDict *)0x0;
      }
      else {
        pZVar1 = cdict + 1;
        pZStack_68 = pZVar1;
        pZStack_60 = pZVar1;
        local_58._0_8_ = pZVar1;
      }
      if (cdict == (ZSTD_CDict *)0x0) {
        __assert_fail("cdict != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3789,
                      "ZSTD_CDict *ZSTD_createCDict_advanced(const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters, ZSTD_customMem)"
                     );
      }
      (cdict->workspace).tableValidEnd = (void *)local_58._0_8_;
      (cdict->workspace).allocStart = (void *)local_58._8_8_;
      (cdict->workspace).allocFailed = uStack_48;
      (cdict->workspace).workspaceOversizedDuration = iStack_44;
      (cdict->workspace).phase = ZStack_40;
      *(undefined4 *)&(cdict->workspace).field_0x3c = uStack_3c;
      (cdict->workspace).workspace = (void *)local_78._0_8_;
      (cdict->workspace).workspaceEnd = (void *)local_78._8_8_;
      (cdict->workspace).objectEnd = pZStack_68;
      (cdict->workspace).tableEnd = pZStack_60;
      _local_78 = ZEXT832(0) << 0x20;
      (cdict->customMem).opaque = customMem.opaque;
      (cdict->customMem).customAlloc = customMem.customAlloc;
      (cdict->customMem).customFree = customMem.customFree;
      cdict->compressionLevel = 0;
      _local_58 = _local_78;
      sVar3 = ZSTD_initCDict_internal
                        (cdict,dictBuffer,dictSize,dictLoadMethod,dictContentType,cParams);
      if (sVar3 < 0xffffffffffffff89) {
        return cdict;
      }
      ZSTD_freeCDict(cdict);
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   size_t const workspaceSize =
            ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict)) +
            ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE) +
            ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0) +
            (dictLoadMethod == ZSTD_dlm_byRef ? 0
             : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))));
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);
        ZSTD_cwksp ws;
        ZSTD_CDict* cdict;

        if (!workspace) {
            ZSTD_free(workspace, customMem);
            return NULL;
        }

        ZSTD_cwksp_init(&ws, workspace, workspaceSize);

        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        assert(cdict != NULL);
        ZSTD_cwksp_move(&cdict->workspace, &ws);
        cdict->customMem = customMem;
        cdict->compressionLevel = 0; /* signals advanced API usage */

        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}